

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O3

void __thiscall RSA::print_last_plaintext_line(RSA *this)

{
  long *plVar1;
  long *plVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  ostream *poVar4;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Plain Text","");
  Crypto::print_header(&this->super_Crypto,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  _Var3._M_current = (this->super_Crypto).plainText._M_dataplus._M_p;
  local_38._M_dataplus._M_p._0_1_ = 0x5f;
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var3,_Var3._M_current + (this->super_Crypto).plainText._M_string_length,
                     (_Iter_equals_val<const_char>)&local_38);
  (this->super_Crypto).plainText._M_string_length =
       (long)_Var3._M_current - (long)(this->super_Crypto).plainText._M_dataplus._M_p;
  *_Var3._M_current = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Text: ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->super_Crypto).plainText._M_dataplus._M_p,
                      (this->super_Crypto).plainText._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  plVar1 = (this->plain_BigInt).vector_value.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar2 = (this->plain_BigInt).vector_value.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((plVar1 != plVar2) && (((long)plVar2 - (long)plVar1 != 8 || (*plVar1 != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Num: ",5);
    poVar4 = operator<<((ostream *)&std::cout,&this->plain_BigInt);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  return;
}

Assistant:

void RSA::print_last_plaintext_line() {
    print_header("Plain Text");
    plainText.erase(std::remove(plainText.begin(), plainText.end(), '_'), plainText.end()); //! remove any special character
    cout << "Text: " << plainText << endl;

    if (!plain_BigInt.isZero())
        cout << "Num: " << plain_BigInt << endl;
}